

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peers.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
Peers::ip2Peers(vector<int,_std::allocator<int>_> *__return_storage_ptr__,Peers *this,string *ip)

{
  bool bVar1;
  mapped_type *__x;
  _Self local_30;
  _Self local_28;
  const_iterator retItr;
  string *ip_local;
  Peers *this_local;
  
  retItr._M_node = (_Base_ptr)ip;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
       ::find(&this->m_ip2PeerMap,ip);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
       ::end(&this->m_ip2PeerMap);
  bVar1 = std::operator!=(&local_28,&local_30);
  if (bVar1) {
    __x = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
          ::at(&this->m_ip2PeerMap,(key_type *)retItr._M_node);
    std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,__x);
  }
  else {
    memset(__return_storage_ptr__,0,0x18);
    std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> Peers::ip2Peers(const std::string &ip) const
{
    auto retItr = m_ip2PeerMap.find(ip);
    if (retItr != m_ip2PeerMap.end())
        return m_ip2PeerMap.at(ip);
    return {};
}